

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# UnscentedKalmanFilterBase.cpp
# Opt level: O1

void __thiscall
UnscentedKalmanFilterBase_computePredictionFromSigmaPoints_Test::
~UnscentedKalmanFilterBase_computePredictionFromSigmaPoints_Test
          (UnscentedKalmanFilterBase_computePredictionFromSigmaPoints_Test *this)

{
  testing::Test::~Test(&this->super_Test);
  operator_delete(this);
  return;
}

Assistant:

TEST(UnscentedKalmanFilterBase, computePredictionFromSigmaPoints) {
    T alpha = 1, beta = 2, kappa = 1;
    
    auto ukf = ConcreteUKF<Vector<T, 3>>(alpha,beta,kappa);
    
    // Init variables
    ukf.sigmaWeights_m << 7, 6, 5, 4, 3, 2, 1;
    
    typename ConcreteUKF<Vector<T,3>>::SigmaPoints<Vector<T,4>> points;
    points <<
         1,  2,  3,  4,  5,  6,  7,
         10,  20,  30,  40,  50,  60,  70,
         100,  200,  300,  400,  500,  600,  700,
         1000,  2000,  3000,  4000,  5000,  6000,  7000;
    
    Vector<T,4> x = ukf.computePredictionFromSigmaPoints<Vector<T,4>>( points );
    
    ASSERT_FLOAT_EQ(84,    x[0]);
    ASSERT_FLOAT_EQ(840,   x[1]);
    ASSERT_FLOAT_EQ(8400,  x[2]);
    ASSERT_FLOAT_EQ(84000, x[3]);
}